

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack.cpp
# Opt level: O0

bool goodform::msgpack::deserialize(istream *input,any *v)

{
  ulong uVar1;
  undefined8 __n;
  any *paVar2;
  byte bVar3;
  bool bVar4;
  __uint16_t _Var5;
  uint uVar6;
  __uint32_t _Var7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  long lVar12;
  char *pcVar13;
  size_type sVar14;
  undefined1 local_338 [8];
  any key_2;
  size_t i_5;
  undefined1 auStack_318 [4];
  uint32_t sz_6;
  _Rb_tree_node_base _Stack_310;
  size_t sStack_2f0;
  __uint32_t local_2dc;
  undefined1 local_2d8 [4];
  uint32_t sz_be_7;
  any key_1;
  size_t i_4;
  undefined1 auStack_2b8 [6];
  uint16_t sz_5;
  _Rb_tree_node_base _Stack_2b0;
  size_t sStack_290;
  __uint16_t local_282;
  ulong uStack_280;
  uint16_t sz_be_6;
  size_t i_3;
  undefined1 local_270 [8];
  array_t a_2;
  ulong uStack_250;
  uint32_t sz_be_5;
  size_t i_2;
  undefined1 local_240 [8];
  array_t a_1;
  undefined1 local_220 [6];
  uint16_t sz_be_4;
  string s_3;
  undefined1 local_1f8 [4];
  uint32_t sz_be_3;
  string s_2;
  undefined1 local_1d0 [6];
  uint16_t sz_be_2;
  string s_1;
  size_t sz_4;
  int64_t val_7;
  int64_t be_7;
  int32_t val_6;
  int32_t be_6;
  int16_t val_5;
  int16_t be_5;
  __uint64_t _Stack_188;
  int8_t val_4;
  uint64_t val_3;
  uint64_t be_4;
  uint32_t val_2;
  uint32_t be_3;
  uint16_t val_1;
  uint16_t be_2;
  double dStack_168;
  uint8_t val;
  numeric_union64 u_1;
  uint64_t be_1;
  __uint32_t local_150;
  numeric_union32 u;
  uint32_t be;
  binary_t b_2;
  uint32_t sz_be_1;
  binary_t b_1;
  undefined1 local_108 [4];
  uint16_t sz_be;
  binary_t b;
  size_t sz_3;
  void *local_e0;
  undefined1 local_d8 [8];
  string s;
  size_t sz_2;
  size_t i_1;
  undefined1 local_a0 [8];
  array_t a;
  size_t sz_1;
  any key;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  local_58;
  void *local_28;
  size_t sz;
  bool ret;
  any *paStack_18;
  uint typeByte;
  any *v_local;
  istream *input_local;
  
  paStack_18 = v;
  v_local = (any *)input;
  uVar6 = std::istream::get();
  sz._4_4_ = uVar6 & 0xff;
  bVar3 = std::ios::good();
  sz._3_1_ = bVar3 & 1;
  if (sz._3_1_ != 0) {
    if (sz._4_4_ < 0x80) {
      sz._2_1_ = (byte)sz._4_4_ & 0x7f;
      std::any::operator=(paStack_18,(uchar *)((long)&sz + 2));
    }
    else if ((sz._4_4_ < 0xe0) || (0xff < sz._4_4_)) {
      if ((sz._4_4_ < 0x80) || (0x8f < sz._4_4_)) {
        if ((sz._4_4_ < 0x90) || (0x9f < sz._4_4_)) {
          if ((sz._4_4_ < 0xa0) || (0xbf < sz._4_4_)) {
            if (sz._4_4_ == 0xc0) {
              local_e0 = (void *)0x0;
              std::any::operator=(paStack_18,&local_e0);
            }
            else if (sz._4_4_ == 0xc2) {
              sz_3._7_1_ = 0;
              std::any::operator=(paStack_18,(bool *)((long)&sz_3 + 7));
            }
            else if (sz._4_4_ == 0xc3) {
              sz_3._6_1_ = 1;
              std::any::operator=(paStack_18,(bool *)((long)&sz_3 + 6));
            }
            else if (sz._4_4_ == 0xc4) {
              uVar6 = std::istream::get();
              b.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
                   ZEXT48(uVar6 & 0xff);
              bVar3 = std::ios::good();
              __n = b.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                std::allocator<char>::allocator();
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)local_108,__n,
                           (allocator_type *)
                           &b_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           &b_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
                paVar2 = v_local;
                pcVar13 = std::vector<char,_std::allocator<char>_>::data
                                    ((vector<char,_std::allocator<char>_> *)local_108);
                std::istream::read((char *)paVar2,(long)pcVar13);
                bVar3 = std::ios::good();
                if ((bVar3 & 1) == 0) {
                  sz._3_1_ = 0;
                }
                else {
                  std::any::operator=(paStack_18,(vector<char,_std::allocator<char>_> *)local_108);
                }
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)local_108);
              }
            }
            else if (sz._4_4_ == 0xc5) {
              std::istream::read((char *)v_local,
                                 (long)&b_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        field_0x14);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                _Var5 = __bswap_16(b_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   _20_2_);
                std::allocator<char>::allocator();
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)&sz_be_1,(ulong)_Var5,
                           (allocator_type *)
                           &b_2.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           &b_2.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
                paVar2 = v_local;
                pcVar13 = std::vector<char,_std::allocator<char>_>::data
                                    ((vector<char,_std::allocator<char>_> *)&sz_be_1);
                std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)&sz_be_1);
                std::istream::read((char *)paVar2,(long)pcVar13);
                bVar3 = std::ios::good();
                if ((bVar3 & 1) == 0) {
                  sz._3_1_ = 0;
                }
                else {
                  std::any::operator=(paStack_18,(vector<char,_std::allocator<char>_> *)&sz_be_1);
                }
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)&sz_be_1);
              }
            }
            else if (sz._4_4_ == 0xc6) {
              std::istream::read((char *)v_local,
                                 (long)&b_2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        field_0x10);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                _Var7 = __bswap_32(b_2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   _16_4_);
                std::allocator<char>::allocator();
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)&be,(ulong)_Var7,
                           (allocator_type *)((long)&u + 3));
                std::allocator<char>::~allocator((allocator<char> *)((long)&u + 3));
                paVar2 = v_local;
                pcVar13 = std::vector<char,_std::allocator<char>_>::data
                                    ((vector<char,_std::allocator<char>_> *)&be);
                std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)&be);
                std::istream::read((char *)paVar2,(long)pcVar13);
                bVar3 = std::ios::good();
                if ((bVar3 & 1) == 0) {
                  sz._3_1_ = 0;
                }
                else {
                  std::any::operator=(paStack_18,(vector<char,_std::allocator<char>_> *)&be);
                }
                std::vector<char,_std::allocator<char>_>::~vector
                          ((vector<char,_std::allocator<char>_> *)&be);
              }
            }
            else if (sz._4_4_ == 0xca) {
              std::istream::read((char *)v_local,(long)&local_150);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                be_1._4_4_ = __bswap_32(local_150);
                std::any::operator=(paStack_18,(float *)((long)&be_1 + 4));
              }
            }
            else if (sz._4_4_ == 0xcb) {
              std::istream::read((char *)v_local,(long)&u_1);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                dStack_168 = (double)__bswap_64(u_1.i);
                std::any::operator=(paStack_18,&stack0xfffffffffffffe98);
              }
            }
            else if (sz._4_4_ == 0xcc) {
              std::istream::read((char *)v_local,(long)&be_3 + 3);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                std::any::operator=(paStack_18,(uchar *)((long)&be_3 + 3));
              }
            }
            else if (sz._4_4_ == 0xcd) {
              std::istream::read((char *)v_local,(long)&be_3);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                val_2._2_2_ = __bswap_16((__uint16_t)be_3);
                std::any::operator=(paStack_18,(unsigned_short *)((long)&val_2 + 2));
              }
            }
            else if (sz._4_4_ == 0xce) {
              std::istream::read((char *)v_local,(long)&be_4 + 4);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                be_4._0_4_ = __bswap_32(be_4._4_4_);
                std::any::operator=(paStack_18,(uint *)&be_4);
              }
            }
            else if (sz._4_4_ == 0xcf) {
              std::istream::read((char *)v_local,(long)&val_3);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                _Stack_188 = __bswap_64(val_3);
                std::any::operator=(paStack_18,&stack0xfffffffffffffe78);
              }
            }
            else if (sz._4_4_ == 0xd0) {
              std::istream::read((char *)v_local,(long)&be_6 + 3);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                std::any::operator=(paStack_18,(char *)((long)&be_6 + 3));
              }
            }
            else if (sz._4_4_ == 0xd1) {
              std::istream::read((char *)v_local,(long)&be_6);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                val_6._2_2_ = __bswap_16((__uint16_t)be_6);
                std::any::operator=(paStack_18,(short *)((long)&val_6 + 2));
              }
            }
            else if (sz._4_4_ == 0xd2) {
              std::istream::read((char *)v_local,(long)&be_7 + 4);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                be_7._0_4_ = __bswap_32(be_7._4_4_);
                std::any::operator=(paStack_18,(int *)&be_7);
              }
            }
            else if (sz._4_4_ == 0xd3) {
              std::istream::read((char *)v_local,(long)&val_7);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                sz_4 = __bswap_64(val_7);
                std::any::operator=(paStack_18,(long *)&sz_4);
              }
            }
            else if (sz._4_4_ == 0xd9) {
              uVar6 = std::istream::get();
              s_1.field_2._8_8_ = ZEXT48(uVar6 & 0xff);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                std::__cxx11::string::string((string *)local_1d0);
                std::__cxx11::string::resize((ulong)local_1d0);
                paVar2 = v_local;
                lVar12 = std::__cxx11::string::operator[]((ulong)local_1d0);
                std::istream::read((char *)paVar2,lVar12);
                bVar3 = std::ios::good();
                if ((bVar3 & 1) == 0) {
                  sz._3_1_ = 0;
                }
                else {
                  std::any::operator=(paStack_18,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1d0);
                }
                std::__cxx11::string::~string((string *)local_1d0);
              }
            }
            else if (sz._4_4_ == 0xda) {
              std::istream::read((char *)v_local,(long)((long)&s_2.field_2 + 0xe));
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                std::__cxx11::string::string((string *)local_1f8);
                __bswap_16(s_2.field_2._14_2_);
                std::__cxx11::string::resize((ulong)local_1f8);
                paVar2 = v_local;
                lVar12 = std::__cxx11::string::operator[]((ulong)local_1f8);
                std::__cxx11::string::size();
                std::istream::read((char *)paVar2,lVar12);
                bVar3 = std::ios::good();
                if ((bVar3 & 1) == 0) {
                  sz._3_1_ = 0;
                }
                else {
                  std::any::operator=(paStack_18,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1f8);
                }
                std::__cxx11::string::~string((string *)local_1f8);
              }
            }
            else if (sz._4_4_ == 0xdb) {
              std::istream::read((char *)v_local,(long)((long)&s_3.field_2 + 0xc));
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                std::__cxx11::string::string((string *)local_220);
                __bswap_32(s_3.field_2._12_4_);
                std::__cxx11::string::resize((ulong)local_220);
                paVar2 = v_local;
                lVar12 = std::__cxx11::string::operator[]((ulong)local_220);
                std::__cxx11::string::size();
                std::istream::read((char *)paVar2,lVar12);
                bVar3 = std::ios::good();
                if ((bVar3 & 1) == 0) {
                  sz._3_1_ = 0;
                }
                else {
                  std::any::operator=(paStack_18,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_220);
                }
                std::__cxx11::string::~string((string *)local_220);
              }
            }
            else if (sz._4_4_ == 0xdc) {
              std::istream::read((char *)v_local,
                                 (long)((long)&a_1.
                                               super__Vector_base<std::any,_std::allocator<std::any>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       6));
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                _Var5 = __bswap_16(a_1.super__Vector_base<std::any,_std::allocator<std::any>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_);
                std::allocator<std::any>::allocator((allocator<std::any> *)((long)&i_2 + 7));
                std::vector<std::any,_std::allocator<std::any>_>::vector
                          ((vector<std::any,_std::allocator<std::any>_> *)local_240,(ulong)_Var5,
                           (allocator<std::any> *)((long)&i_2 + 7));
                std::allocator<std::any>::~allocator((allocator<std::any> *)((long)&i_2 + 7));
                uStack_250 = 0;
                while( true ) {
                  bVar4 = false;
                  if ((sz._3_1_ & 1) != 0) {
                    sVar14 = std::vector<std::any,_std::allocator<std::any>_>::size
                                       ((vector<std::any,_std::allocator<std::any>_> *)local_240);
                    bVar4 = uStack_250 < sVar14;
                  }
                  paVar2 = v_local;
                  if (!bVar4) break;
                  pvVar11 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                                      ((vector<std::any,_std::allocator<std::any>_> *)local_240,
                                       uStack_250);
                  sz._3_1_ = deserialize((istream *)paVar2,pvVar11);
                  uStack_250 = uStack_250 + 1;
                }
                std::any::operator=(paStack_18,
                                    (vector<std::any,_std::allocator<std::any>_> *)local_240);
                std::vector<std::any,_std::allocator<std::any>_>::~vector
                          ((vector<std::any,_std::allocator<std::any>_> *)local_240);
              }
            }
            else if (sz._4_4_ == 0xdd) {
              std::istream::read((char *)v_local,
                                 (long)((long)&a_2.
                                               super__Vector_base<std::any,_std::allocator<std::any>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4));
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                _Var7 = __bswap_32(a_2.super__Vector_base<std::any,_std::allocator<std::any>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
                std::allocator<std::any>::allocator((allocator<std::any> *)((long)&i_3 + 7));
                std::vector<std::any,_std::allocator<std::any>_>::vector
                          ((vector<std::any,_std::allocator<std::any>_> *)local_270,(ulong)_Var7,
                           (allocator<std::any> *)((long)&i_3 + 7));
                std::allocator<std::any>::~allocator((allocator<std::any> *)((long)&i_3 + 7));
                uStack_280 = 0;
                while( true ) {
                  uVar1 = uStack_280;
                  bVar4 = false;
                  if ((sz._3_1_ & 1) != 0) {
                    sVar14 = std::vector<std::any,_std::allocator<std::any>_>::size
                                       ((vector<std::any,_std::allocator<std::any>_> *)local_270);
                    bVar4 = uVar1 < sVar14;
                  }
                  paVar2 = v_local;
                  if (!bVar4) break;
                  pvVar11 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                                      ((vector<std::any,_std::allocator<std::any>_> *)local_270,
                                       uStack_280);
                  sz._3_1_ = deserialize((istream *)paVar2,pvVar11);
                  uStack_280 = uStack_280 + 1;
                }
                std::any::operator=(paStack_18,
                                    (vector<std::any,_std::allocator<std::any>_> *)local_270);
                std::vector<std::any,_std::allocator<std::any>_>::~vector
                          ((vector<std::any,_std::allocator<std::any>_> *)local_270);
              }
            }
            else if (sz._4_4_ == 0xde) {
              std::istream::read((char *)v_local,(long)&local_282);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                _Stack_2b0._M_right = (_Base_ptr)0x0;
                sStack_290 = 0;
                _Stack_2b0._M_parent = (_Base_ptr)0x0;
                _Stack_2b0._M_left = (_Base_ptr)0x0;
                _auStack_2b8 = 0;
                _Stack_2b0._M_color = _S_red;
                _Stack_2b0._4_4_ = 0;
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)auStack_2b8);
                std::any::operator=(paStack_18,
                                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                     *)auStack_2b8);
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                        *)auStack_2b8);
                _Var5 = __bswap_16(local_282);
                for (key_1._M_storage._M_ptr = (void *)0x0;
                    (sz._3_1_ & 1) != 0 && key_1._M_storage._M_ptr < (void *)(ulong)_Var5;
                    key_1._M_storage._M_ptr = key_1._M_storage._M_ptr + 1) {
                  std::any::any((any *)local_2d8);
                  bVar4 = deserialize((istream *)v_local,(any *)local_2d8);
                  if ((bVar4) &&
                     (bVar4 = is<std::__cxx11::string>((any *)local_2d8), paVar2 = v_local, bVar4))
                  {
                    pmVar8 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                       (paStack_18);
                    pbVar9 = get<std::__cxx11::string>((any *)local_2d8);
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                              ::operator[](pmVar8,pbVar9);
                    sz._3_1_ = deserialize((istream *)paVar2,pmVar10);
                  }
                  else {
                    sz._3_1_ = false;
                  }
                  std::any::~any((any *)local_2d8);
                }
              }
            }
            else if (sz._4_4_ == 0xdf) {
              std::istream::read((char *)v_local,(long)&local_2dc);
              bVar3 = std::ios::good();
              sz._3_1_ = bVar3 & 1;
              if (sz._3_1_ != 0) {
                _Stack_310._M_right = (_Base_ptr)0x0;
                sStack_2f0 = 0;
                _Stack_310._M_parent = (_Base_ptr)0x0;
                _Stack_310._M_left = (_Base_ptr)0x0;
                _auStack_318 = 0;
                _Stack_310._M_color = _S_red;
                _Stack_310._4_4_ = 0;
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)auStack_318);
                std::any::operator=(paStack_18,
                                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                                     *)auStack_318);
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                        *)auStack_318);
                _Var7 = __bswap_32(local_2dc);
                for (key_2._M_storage._M_ptr = (void *)0x0;
                    (sz._3_1_ & 1) != 0 && key_2._M_storage._M_ptr < (void *)(ulong)_Var7;
                    key_2._M_storage._M_ptr = key_2._M_storage._M_ptr + 1) {
                  std::any::any((any *)local_338);
                  bVar4 = deserialize((istream *)v_local,(any *)local_338);
                  if ((bVar4) &&
                     (bVar4 = is<std::__cxx11::string>((any *)local_338), paVar2 = v_local, bVar4))
                  {
                    pmVar8 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                       (paStack_18);
                    pbVar9 = get<std::__cxx11::string>((any *)local_338);
                    pmVar10 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                              ::operator[](pmVar8,pbVar9);
                    sz._3_1_ = deserialize((istream *)paVar2,pmVar10);
                  }
                  else {
                    sz._3_1_ = false;
                  }
                  std::any::~any((any *)local_338);
                }
              }
            }
            else {
              sz._3_1_ = 0;
            }
          }
          else {
            s.field_2._8_8_ = ZEXT48(sz._4_4_ & 0x1f);
            std::__cxx11::string::string((string *)local_d8);
            std::__cxx11::string::resize((ulong)local_d8);
            paVar2 = v_local;
            lVar12 = std::__cxx11::string::operator[]((ulong)local_d8);
            std::istream::read((char *)paVar2,lVar12);
            bVar3 = std::ios::good();
            if ((bVar3 & 1) == 0) {
              sz._3_1_ = 0;
            }
            else {
              std::any::operator=(paStack_18,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8);
            }
            std::__cxx11::string::~string((string *)local_d8);
          }
        }
        else {
          uVar6 = sz._4_4_ & 0xf;
          a.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)(ulong)uVar6;
          std::allocator<std::any>::allocator((allocator<std::any> *)((long)&i_1 + 7));
          std::vector<std::any,_std::allocator<std::any>_>::vector
                    ((vector<std::any,_std::allocator<std::any>_> *)local_a0,(size_type)(ulong)uVar6
                     ,(allocator<std::any> *)((long)&i_1 + 7));
          std::allocator<std::any>::~allocator((allocator<std::any> *)((long)&i_1 + 7));
          for (sz_2 = 0; paVar2 = v_local,
              sz_2 < a.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage; sz_2 = sz_2 + 1) {
            pvVar11 = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                                ((vector<std::any,_std::allocator<std::any>_> *)local_a0,sz_2);
            deserialize((istream *)paVar2,pvVar11);
          }
          std::any::operator=(paStack_18,(vector<std::any,_std::allocator<std::any>_> *)local_a0);
          std::vector<std::any,_std::allocator<std::any>_>::~vector
                    ((vector<std::any,_std::allocator<std::any>_> *)local_a0);
        }
      }
      else {
        local_28 = (void *)(ulong)(sz._4_4_ & 0xf);
        local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        local_58._M_t._M_impl._0_8_ = 0;
        local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
        ::map(&local_58);
        std::any::operator=(paStack_18,&local_58);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
        ::~map(&local_58);
        for (key._M_storage._M_ptr = (void *)0x0; key._M_storage._M_ptr < local_28;
            key._M_storage._M_ptr = key._M_storage._M_ptr + 1) {
          std::any::any((any *)&sz_1);
          bVar4 = deserialize((istream *)v_local,(any *)&sz_1);
          if ((bVar4) && (bVar4 = is<std::__cxx11::string>((any *)&sz_1), paVar2 = v_local, bVar4))
          {
            pmVar8 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                               (paStack_18);
            pbVar9 = get<std::__cxx11::string>((any *)&sz_1);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                      ::operator[](pmVar8,pbVar9);
            sz._3_1_ = deserialize((istream *)paVar2,pmVar10);
          }
          else {
            sz._3_1_ = false;
          }
          std::any::~any((any *)&sz_1);
        }
      }
    }
    else {
      sz._1_1_ = -((byte)sz._4_4_ & 0x1f);
      std::any::operator=(paStack_18,(char *)((long)&sz + 1));
    }
  }
  return (bool)(sz._3_1_ & 1);
}

Assistant:

bool msgpack::deserialize(std::istream& input, any& v)
  {
    unsigned int typeByte = static_cast<unsigned int>(0xFF & input.get());
    bool ret = input.good();
    if (ret)
    {
      if (/*typeByte >= 0x00 &&*/ typeByte <= 0x7F) // positive fixint 0xxxxxxx
      {
        v = std::uint8_t(0x7F & typeByte);
      }
      else if (typeByte >= 0xE0 && typeByte <= 0xFF) // negative fixint	111xxxxx
      {
        v = std::int8_t((0x1F & typeByte ) * -1);
      }
      else if (typeByte >= 0x80 && typeByte <= 0x8F) // fixmap	1000xxxx
      {
        std::size_t sz(0x0F & typeByte);
        v = goodform::object_t();
        for (size_t i = 0; i < sz; ++i)
        {
          any key;
          if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
            ret = false;
          else
            ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
        }
      }
      else if (typeByte >= 0x90 && typeByte <= 0x9F) // fixarray	1001xxxx
      {
        std::size_t sz(0x0F & typeByte);
        goodform::array_t a(sz);
        for (size_t i = 0; i < sz; ++i)
          msgpack::deserialize(input, a[i]);
        v = std::move(a);
      }
      else if (typeByte >= 0xA0 && typeByte <= 0xBF) // fixstr	101xxxxx
      {
        std::size_t sz(0x1F & typeByte);
        std::string s;
        s.resize(sz);
        input.read(&s[0], sz);
        if (!input.good())
          ret = false;
        else
          v = std::move(s);
      }
      else if (typeByte == 0xC0) // null
      {
        v = nullptr;
      }
      else if (typeByte == 0xC2) // false
      {
        v = false;
      }
      else if (typeByte == 0xC3) // true
      {
        v = true;
      }
      else if (typeByte == 0xC4) // Bin 8
      {
        std::size_t sz (0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          goodform::binary_t b(sz);
          if (!input.read(b.data(), sz).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC5) // Bin 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be16toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xC6) // Bin 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::binary_t b(be32toh(sz_be));
          if (!input.read(b.data(), b.size()).good())
            ret = false;
          else
            v = std::move(b);
        }
      }
      else if (typeByte == 0xCA) // Float 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union32 u;
          u.i = be32toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCB) // Float 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          numeric_union64 u;
          u.i = be64toh(be);
          v = u.f;
        }
      }
      else if (typeByte == 0xCC) // Uint 8
      {
        std::uint8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xCD) // Uint 16
      {
        std::uint16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCE) // Uint 32
      {
        std::uint32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xCF) // Uint 64
      {
        std::uint64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::uint64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD0) // Int 8
      {
        std::int8_t val;
        ret = input.read((char*)&val, sizeof(val)).good();
        if (ret)
          v = val;
      }
      else if (typeByte == 0xD1) // Int 16
      {
        std::int16_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int16_t val(be16toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD2) // Int 32
      {
        std::int32_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int32_t val(be32toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD3) // Int 64
      {
        std::int64_t be;
        ret = input.read((char*)&be, sizeof(be)).good();
        if (ret)
        {
          std::int64_t val(be64toh(be));
          v = val;
        }
      }
      else if (typeByte == 0xD9) // str 8
      {
        std::size_t sz(0xFF & static_cast<unsigned int>(input.get()));
        ret = input.good();
        if (ret)
        {
          std::string s;
          s.resize(sz);
          if (!input.read(&s[0], sz).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDA) // str 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be16toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDB) // str 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          std::string s;
          s.resize(be32toh(sz_be));
          if (!input.read(&s[0], s.size()).good())
            ret = false;
          else
            v = std::move(s);
        }
      }
      else if (typeByte == 0xDC) // array 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be16toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDD) // array 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          goodform::array_t a(be32toh(sz_be));
          for (size_t i = 0; ret && i < a.size(); ++i)
            ret = msgpack::deserialize(input, a[i]);
          v = std::move(a);
        }
      }
      else if (typeByte == 0xDE) // map 16
      {
        std::uint16_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint16_t sz(be16toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else if (typeByte == 0xDF) // map 32
      {
        std::uint32_t sz_be;
        ret = input.read((char*)&sz_be, sizeof(sz_be)).good();
        if (ret)
        {
          v = object_t();
          std::uint32_t sz(be32toh(sz_be));
          for (size_t i = 0; ret && i < sz; ++i)
          {
            any key;
            if (!msgpack::deserialize(input, key) || !is<std::string>(key)) // Only supporting string keys.
              ret = false;
            else
              ret = msgpack::deserialize(input, get<object_t>(v)[get<std::string>(key)]);
          }
        }
      }
      else // Not Supported
      {
        ret = false;
      }
    }

    return ret;
  }